

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend-reg.cpp
# Opt level: O3

ggml_backend_dev_t ggml_backend_dev_by_type(ggml_backend_dev_type type)

{
  ggml_backend_dev_type gVar1;
  ggml_backend_dev_t pgVar2;
  size_t index;
  
  get_reg();
  if (get_reg::reg.devices.
      super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      get_reg::reg.devices.
      super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    index = 0;
    do {
      pgVar2 = ggml_backend_dev_get(index);
      gVar1 = ggml_backend_dev_type(pgVar2);
      if (gVar1 == type) {
        return pgVar2;
      }
      index = index + 1;
      get_reg();
    } while (index < (ulong)((long)get_reg::reg.devices.
                                   super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)get_reg::reg.devices.
                                   super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return (ggml_backend_dev_t)0x0;
}

Assistant:

ggml_backend_dev_t ggml_backend_dev_by_type(enum ggml_backend_dev_type type) {
    for (size_t i = 0; i < ggml_backend_dev_count(); i++) {
        ggml_backend_dev_t dev = ggml_backend_dev_get(i);
        if (ggml_backend_dev_type(dev) == type) {
            return dev;
        }
    }
    return nullptr;
}